

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_builder.hpp
# Opt level: O0

vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
* __thiscall
pico_tree::internal::
build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
::operator()(build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_784UL>
             *this,space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                   space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule,size_t forest_size)

{
  undefined8 in_RDX;
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  in_RDI;
  ulong in_stack_00000008;
  kd_tree_data_type t;
  space_type s;
  point<float,_784UL> r;
  size_t i;
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  *trees;
  value_type *__x;
  kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>
  *in_stack_ffffffffffffb558;
  kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>
  *in_stack_ffffffffffffb560;
  size_type in_stack_ffffffffffffb578;
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  *in_stack_ffffffffffffb580;
  rotation_type *in_stack_ffffffffffffb590;
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  in_stack_ffffffffffffb598;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *in_stack_ffffffffffffce98;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_stack_ffffffffffffcea0;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_ffffffffffffcea8;
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_784UL>
  *in_stack_ffffffffffffceb0;
  space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
  in_stack_ffffffffffffceb8;
  space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_> local_2590 [6352];
  undefined8 local_cc0;
  space_type local_cb8;
  undefined8 local_c98;
  undefined1 local_c90 [3136];
  ulong local_50;
  undefined1 local_31;
  undefined8 local_10;
  
  local_31 = 0;
  local_10 = in_RDX;
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  ::vector((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
            *)0x10e2a9);
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
  ::reserve(in_stack_ffffffffffffb580,in_stack_ffffffffffffb578);
  for (local_50 = 0; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
    local_c98 = local_10;
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
    random_rotation<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>>>
              (in_RDI);
    local_cc0 = local_10;
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
    rotate_space<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>>>
              (in_stack_ffffffffffffb590,in_stack_ffffffffffffb598);
    space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>::space_wrapper
              (local_2590,&local_cb8);
    build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>,784ul>
    ::operator()(in_stack_ffffffffffffceb0,in_stack_ffffffffffffceb8,in_stack_ffffffffffffcea8,
                 in_stack_ffffffffffffcea0,in_stack_ffffffffffffce98);
    memcpy(&stack0xffffffffffffb550,local_c90,0xc40);
    __x = (value_type *)&stack0xffffffffffffc190;
    matrix_space<float,_784UL>::matrix_space
              ((matrix_space<float,_784UL> *)in_RDI.space_,(matrix_space<float,_784UL> *)__x);
    kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>::kd_tree_data
              (in_stack_ffffffffffffb560,in_stack_ffffffffffffb558);
    std::
    vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
    ::push_back((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
                 *)in_RDI.space_,__x);
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>::
    ~rkd_tree_hh_data((rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>
                       *)in_RDI.space_);
    kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>::~kd_tree_data
              ((kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL> *)
               in_RDI.space_);
    matrix_space<float,_784UL>::~matrix_space((matrix_space<float,_784UL> *)0x10e3ff);
  }
  return (vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>_>
          *)in_RDI.space_;
}

Assistant:

std::vector<rkd_tree_data_type> operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const& rule,
      size_t forest_size) {
    assert(forest_size > 0);

    using space_wrapper_type = typename rkd_tree_data_type::space_wrapper_type;
    using build_kd_tree_type = build_kd_tree<kd_tree_data_type, Dim_>;

    std::vector<rkd_tree_data_type> trees;
    trees.reserve(forest_size);
    for (std::size_t i = 0; i < forest_size; ++i) {
      auto r = rkd_tree_data_type::random_rotation(space);
      auto s = rkd_tree_data_type::rotate_space(r, space);
      auto t = build_kd_tree_type()(
          space_wrapper_type(s), stop_condition, start_bounds, rule);
      trees.push_back({std::move(r), std::move(s), std::move(t)});
    }
    return trees;
  }